

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2CBus.h
# Opt level: O3

int SetOptionsI2CBus(I2CBUS *pI2CBus,UINT usbissoperatingmode,UINT BaudRate,UINT timeout)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint8 usbissreadbuf [2];
  uint8 usbisswritebuf [6];
  char local_28 [6];
  undefined1 local_22;
  
  pI2CBus->BaudRate = BaudRate;
  if (pI2CBus->DevType != 0) {
    if (pI2CBus->DevType != 1) {
      return 1;
    }
    iVar1 = SetOptionsComputerRS232Port
                      (pI2CBus->hDev,BaudRate,pI2CBus->ParityMode,pI2CBus->bCheckParity,
                       pI2CBus->nbDataBits,pI2CBus->StopBitsMode,timeout);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = (int)(48000000 / (ulong)(BaudRate + 0x10)) + -1;
    local_28[2] = 'Z';
    local_28[3] = '\x02';
    local_28[5] = (char)((uint)iVar1 >> 8);
    local_22 = (undefined1)iVar1;
    iVar1 = (pI2CBus->RS232Port).DevType;
    local_28[4] = (char)usbissoperatingmode;
    if (iVar1 - 1U < 4) {
      iVar1 = (pI2CBus->RS232Port).s;
      uVar6 = 0;
      do {
        sVar2 = send(iVar1,local_28 + (ulong)uVar6 + 2,(ulong)(5 - uVar6),0);
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar6 = uVar6 + (int)sVar2;
      } while ((int)uVar6 < 5);
    }
    else {
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = *(int *)&(pI2CBus->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar2 = write(iVar1,local_28 + (ulong)uVar6 + 2,(ulong)(5 - uVar6));
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar6 = uVar6 + (int)sVar2;
      } while (uVar6 < 5);
    }
    iVar1 = (pI2CBus->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pI2CBus->RS232Port).s;
      uVar4 = 0;
      do {
        sVar2 = recv(iVar1,local_28 + uVar4,(ulong)(2 - (int)uVar4),0);
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar6 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar6;
      } while ((int)uVar6 < 2);
    }
    else {
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = *(int *)&(pI2CBus->RS232Port).hDev;
      lVar5 = 0;
      do {
        iVar3 = (int)lVar5;
        sVar2 = read(iVar1,local_28 + lVar5,(ulong)(2 - iVar3));
        if ((int)sVar2 < 1) {
          return 1;
        }
        lVar5 = 1;
      } while ((uint)(iVar3 + (int)sVar2) < 2);
    }
    if (local_28[0] != -1) {
      return 1;
    }
    if (local_28[1] != '\0') {
      return 1;
    }
  }
  return 0;
}

Assistant:

inline int SetOptionsI2CBus(I2CBUS* pI2CBus, UINT usbissoperatingmode, UINT BaudRate, UINT timeout)
{
	uint8 usbisswritebuf[6];
	UINT usbisswritebuflen = 0;
	uint8 usbissreadbuf[2];
	UINT usbissreadbuflen = 2;
	UINT usbissbaudrate = (48000000/(16+BaudRate))-1;
	uint8 usbissbaudratedivhigh = (uint8)(usbissbaudrate >> 8);
	uint8 usbissbaudratedivlow = (uint8)usbissbaudrate;

	pI2CBus->BaudRate = BaudRate;

	switch (pI2CBus->DevType)
	{
	case USBISS_TYPE_I2CBUS:
		if (SetOptionsComputerRS232Port(pI2CBus->hDev, BaudRate, pI2CBus->ParityMode, pI2CBus->bCheckParity, pI2CBus->nbDataBits, pI2CBus->StopBitsMode, timeout) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_ERROR_I2CBUS(("SetOptionsI2CBus error (%s) : %s"
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n", 
				strtime_m(), 
				"SetOptionsComputerRS232Port failed. ", 
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		usbisswritebuf[0] = (uint8)0x5A; // USB-ISS setup.
		usbisswritebuf[1] = (uint8)0x02; // ISS_MODE.
		usbisswritebuf[2] = (uint8)usbissoperatingmode;
		usbisswritebuf[3] = (uint8)usbissbaudratedivhigh;
		usbisswritebuf[4] = (uint8)usbissbaudratedivlow;
		usbisswritebuflen = 5;
		if (WriteAllRS232Port(&pI2CBus->RS232Port, usbisswritebuf, usbisswritebuflen) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus error (%s) : %s",
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n",
				strtime_m(),
				"WriteAllRS232Port failed. ",
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		if (ReadAllRS232Port(&pI2CBus->RS232Port, usbissreadbuf, usbissreadbuflen) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus error (%s) : %s",
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n",
				strtime_m(),
				"ReadAllRS232Port failed. ",
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		if ((usbissreadbuf[0] != 0xFF)||(usbissreadbuf[1] != 0x00))
		{
			PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus error (%s) : %s",
				"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n",
				strtime_m(),
				"USB-ISS error. ",
				pI2CBus, usbissoperatingmode, BaudRate, timeout));
			return EXIT_FAILURE;
		}
		break;
	case LOCAL_TYPE_I2CBUS:
		PRINT_DEBUG_WARNING_I2CBUS(("SetOptionsI2CBus warning (%s) : %s"
			"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n", 
			strtime_m(), 
			"Please check the specific configuration of the computer. ", 
			pI2CBus, usbissoperatingmode, BaudRate, timeout));
		break;
	default:
		PRINT_DEBUG_ERROR_I2CBUS(("SetOptionsI2CBus error (%s) : %s"
			"(pI2CBus=%#x, usbissoperatingmode=%#x, BaudRate=%u, timeout=%u)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pI2CBus, usbissoperatingmode, BaudRate, timeout));
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}